

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_common.h
# Opt level: O0

_Bool is_backward_size_valid(lzma_stream_flags *options)

{
  _Bool local_11;
  lzma_stream_flags *options_local;
  
  local_11 = false;
  if ((3 < options->backward_size) && (local_11 = false, options->backward_size < 0x400000001)) {
    local_11 = (options->backward_size & 3) == 0;
  }
  return local_11;
}

Assistant:

static inline bool
is_backward_size_valid(const lzma_stream_flags *options)
{
	return options->backward_size >= LZMA_BACKWARD_SIZE_MIN
			&& options->backward_size <= LZMA_BACKWARD_SIZE_MAX
			&& (options->backward_size & 3) == 0;
}